

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * validateInnerProductWeightsBias
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
                   WeightParams *bias)

{
  int iVar1;
  ConvolutionLayerParams *pCVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  string *layerName;
  uint uVar6;
  char cVar7;
  bool bVar8;
  ulong uVar9;
  long *plVar10;
  undefined8 *puVar11;
  byte bVar12;
  size_type *psVar13;
  ulong *puVar14;
  ulong uVar15;
  byte bVar16;
  char cVar17;
  undefined8 uVar18;
  uint uVar19;
  unsigned_long uVar20;
  byte bVar21;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string layer_type;
  string __str_2;
  string __str_3;
  string local_230;
  unsigned_long local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ulong local_1c8;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  undefined1 local_1b0 [24];
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  ulong *local_f8;
  uint local_f0;
  undefined4 uStack_ec;
  ulong local_e8 [2];
  ulong *local_d8;
  uint local_d0;
  undefined4 uStack_cc;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(__return_storage_ptr__);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  if (layer->_oneof_case_[0] == 0x415) {
    pCVar2 = (layer->layer_).convolution_;
    local_1c8 = *(ulong *)&pCVar2->_kernelsize_cached_byte_size_;
    local_210._0_4_ = (pCVar2->stride_).current_size_;
    local_210._4_4_ = (pCVar2->stride_).total_size_;
    bVar21 = *(byte *)((long)&(pCVar2->stride_).rep_ + 2);
    std::__cxx11::string::_M_replace((ulong)&local_198,0,(char *)0x0,0x62fbd3);
  }
  else {
    if (layer->_oneof_case_[0] != 0x8c) goto LAB_00537200;
    pCVar2 = (layer->layer_).convolution_;
    local_1c8 = *(ulong *)&pCVar2->_kernelsize_cached_byte_size_;
    local_210._0_4_ = (pCVar2->stride_).current_size_;
    local_210._4_4_ = (pCVar2->stride_).total_size_;
    bVar21 = *(byte *)&(pCVar2->stride_).rep_;
    std::__cxx11::string::_M_replace((ulong)&local_198,0,(char *)0x0,0x630c89);
  }
  iVar1 = (weights->floatvalue_).current_size_;
  uVar9 = (ulong)iVar1;
  uVar15 = ((weights->float16value_).ptr_)->_M_string_length;
  uVar19 = (0 < (long)uVar9) + 1;
  if (uVar15 == 0) {
    uVar19 = (uint)(0 < (long)uVar9);
  }
  sVar3 = ((weights->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((weights->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar4 == 0);
  uVar19 = (uVar19 - (sVar3 == 0)) + 2;
  bVar16 = 4;
  bVar12 = 4;
  if (uVar19 - uVar6 < 2) {
    bVar12 = 5;
    if (uVar19 != uVar6) {
      bVar12 = iVar1 < 1;
    }
    if (((((uVar15 == 0) && (iVar1 < 1)) && (uVar19 != uVar6)) &&
        (((sVar3 == 0 ||
          (weights == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (bVar12 = 2, weights->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar4 == 0 ||
         (weights == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
        (bVar12 = 3, weights->quantization_ == (QuantizationParams *)0x0)))) {
      bVar12 = 5;
    }
  }
  iVar1 = (bias->floatvalue_).current_size_;
  sVar3 = ((bias->float16value_).ptr_)->_M_string_length;
  uVar19 = (0 < iVar1) + 1;
  if (sVar3 == 0) {
    uVar19 = (uint)(0 < iVar1);
  }
  sVar4 = ((bias->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((bias->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar19 = (uVar19 - (sVar4 == 0)) + 2;
  if (uVar19 - uVar6 < 2) {
    bVar16 = 5;
    if (uVar19 != uVar6) {
      bVar16 = iVar1 < 1;
    }
    if ((((sVar3 == 0) && (iVar1 < 1)) && (uVar19 != uVar6)) &&
       ((((sVar4 == 0 ||
          (bias == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (bVar16 = 2, bias->quantization_ == (QuantizationParams *)0x0)) &&
        (((sVar5 == 0 ||
          (bias == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (bVar16 = 3, bias->quantization_ == (QuantizationParams *)0x0)))))) {
      bVar16 = 5;
    }
  }
  if ((bVar12 == 4) || ((bVar16 == 4 & bVar21) != 0)) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    std::__cxx11::string::append((char *)&local_208);
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_208,(ulong)(((layer->name_).ptr_)->_M_dataplus)._M_p);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    psVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1e8.field_2._M_allocated_capacity = *psVar13;
      local_1e8.field_2._8_8_ = puVar11[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar13;
      local_1e8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_1e8._M_string_length = puVar11[1];
    *puVar11 = psVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_230.field_2._M_allocated_capacity = *psVar13;
      local_230.field_2._8_8_ = plVar10[3];
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar13;
      local_230._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_230._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CoreML::Result::Result((Result *)local_1c0,INVALID_MODEL_PARAMETERS,&local_230);
LAB_00537177:
    __return_storage_ptr__->m_type = local_1c0._0_4_;
    __return_storage_ptr__->m_reason = local_1c0._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_1b8);
    if (local_1b8._M_p != local_1b0 + 8) {
      operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_208.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_208._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_00537200;
  }
  else {
    if ((bVar21 != 0) && (((bVar12 == 1 && (bVar16 == 0)) || ((bVar12 == 0 && (bVar16 == 1)))))) {
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_198._M_dataplus._M_p,
                 local_198._M_dataplus._M_p + local_198._M_string_length);
      std::__cxx11::string::append((char *)&local_208);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_208,
                                   (ulong)(((layer->name_).ptr_)->_M_dataplus)._M_p);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      psVar13 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_1e8.field_2._M_allocated_capacity = *psVar13;
        local_1e8.field_2._8_8_ = plVar10[3];
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar13;
        local_1e8._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_1e8._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      psVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_230.field_2._M_allocated_capacity = *psVar13;
        local_230.field_2._8_8_ = puVar11[3];
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar13;
        local_230._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_230._M_string_length = puVar11[1];
      *puVar11 = psVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      CoreML::Result::Result((Result *)local_1c0,INVALID_MODEL_PARAMETERS,&local_230);
      goto LAB_00537177;
    }
    if (bVar12 < 2) {
      uVar15 = uVar15 >> 1;
      if (bVar12 == 0) {
        uVar15 = uVar9;
      }
      if (local_1c8 * local_210 - uVar15 == 0) goto LAB_005370bb;
      std::operator+(&local_50,"Layer \'",(layer->name_).ptr_);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar14 = (ulong *)(plVar10 + 2);
      if ((ulong *)*plVar10 == puVar14) {
        local_a8 = *puVar14;
        lStack_a0 = plVar10[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *puVar14;
        local_b8 = (ulong *)*plVar10;
      }
      local_b0 = plVar10[1];
      *plVar10 = (long)puVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      cVar17 = '\x01';
      if (9 < uVar15) {
        uVar9 = uVar15;
        cVar7 = '\x04';
        do {
          cVar17 = cVar7;
          if (uVar9 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_0053765c;
          }
          if (uVar9 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_0053765c;
          }
          if (uVar9 < 10000) goto LAB_0053765c;
          bVar8 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar7 = cVar17 + '\x04';
        } while (bVar8);
        cVar17 = cVar17 + '\x01';
      }
LAB_0053765c:
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct((ulong)&local_d8,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d8,local_d0,uVar15);
      uVar15 = CONCAT44(uStack_cc,local_d0) + local_b0;
      uVar9 = 0xf;
      if (local_b8 != &local_a8) {
        uVar9 = local_a8;
      }
      if (uVar9 < uVar15) {
        uVar9 = 0xf;
        if (local_d8 != local_c8) {
          uVar9 = local_c8[0];
        }
        if (uVar9 < uVar15) goto LAB_005376df;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_005376df:
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
      }
      local_78 = &local_68;
      plVar10 = puVar11 + 2;
      if ((long *)*puVar11 == plVar10) {
        local_68 = *plVar10;
        uStack_60 = puVar11[3];
      }
      else {
        local_68 = *plVar10;
        local_78 = (long *)*puVar11;
      }
      local_70 = puVar11[1];
      *puVar11 = plVar10;
      puVar11[1] = 0;
      *(undefined1 *)plVar10 = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_78);
      puVar14 = (ulong *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_158.field_2._M_allocated_capacity = *puVar14;
        local_158.field_2._8_8_ = plVar10[3];
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *puVar14;
        local_158._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_158._M_string_length = plVar10[1];
      *plVar10 = (long)puVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      cVar17 = '\x01';
      if (9 < local_1c8) {
        uVar15 = local_1c8;
        cVar7 = '\x04';
        do {
          cVar17 = cVar7;
          if (uVar15 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_00537823;
          }
          if (uVar15 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_00537823;
          }
          if (uVar15 < 10000) goto LAB_00537823;
          bVar8 = 99999 < uVar15;
          uVar15 = uVar15 / 10000;
          cVar7 = cVar17 + '\x04';
        } while (bVar8);
        cVar17 = cVar17 + '\x01';
      }
LAB_00537823:
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct((ulong)&local_f8,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f8,local_f0,local_1c8);
      uVar15 = CONCAT44(uStack_ec,local_f0) + local_158._M_string_length;
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        uVar18 = local_158.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < uVar15) {
        uVar9 = 0xf;
        if (local_f8 != local_e8) {
          uVar9 = local_e8[0];
        }
        if (uVar9 < uVar15) goto LAB_005378ab;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_f8,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
      }
      else {
LAB_005378ab:
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_f8);
      }
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_118.field_2._M_allocated_capacity = *psVar13;
        local_118.field_2._8_8_ = puVar11[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar13;
        local_118._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_118._M_string_length = puVar11[1];
      *puVar11 = psVar13;
      puVar11[1] = 0;
      *(undefined1 *)psVar13 = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_118);
      puVar14 = (ulong *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_138.field_2._M_allocated_capacity = *puVar14;
        local_138.field_2._8_8_ = plVar10[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *puVar14;
        local_138._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_138._M_string_length = plVar10[1];
      *plVar10 = (long)puVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      cVar17 = '\x01';
      if (9 < local_210) {
        uVar20 = local_210;
        cVar7 = '\x04';
        do {
          cVar17 = cVar7;
          if (uVar20 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_005379ea;
          }
          if (uVar20 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_005379ea;
          }
          if (uVar20 < 10000) goto LAB_005379ea;
          bVar8 = 99999 < uVar20;
          uVar20 = uVar20 / 10000;
          cVar7 = cVar17 + '\x04';
        } while (bVar8);
        cVar17 = cVar17 + '\x01';
      }
LAB_005379ea:
      local_98 = local_88;
      std::__cxx11::string::_M_construct((ulong)&local_98,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,local_90,local_210);
      uVar15 = CONCAT44(uStack_8c,local_90) + local_138._M_string_length;
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        uVar18 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < uVar15) {
        uVar9 = 0xf;
        if (local_98 != local_88) {
          uVar9 = local_88[0];
        }
        if (uVar9 < uVar15) goto LAB_00537a6f;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_98,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
      }
      else {
LAB_00537a6f:
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_98);
      }
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      psVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_178.field_2._M_allocated_capacity = *psVar13;
        local_178.field_2._8_8_ = puVar11[3];
      }
      else {
        local_178.field_2._M_allocated_capacity = *psVar13;
        local_178._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_178._M_string_length = puVar11[1];
      *puVar11 = psVar13;
      puVar11[1] = 0;
      *(undefined1 *)psVar13 = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
      psVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_208.field_2._M_allocated_capacity = *psVar13;
        local_208.field_2._8_8_ = puVar11[3];
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar13;
        local_208._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_208._M_string_length = puVar11[1];
      *puVar11 = psVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_208,(ulong)local_198._M_dataplus._M_p);
      psVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_1e8.field_2._M_allocated_capacity = *psVar13;
        local_1e8.field_2._8_8_ = puVar11[3];
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar13;
        local_1e8._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_1e8._M_string_length = puVar11[1];
      *puVar11 = psVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
      psVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_230.field_2._M_allocated_capacity = *psVar13;
        local_230.field_2._8_8_ = puVar11[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar13;
        local_230._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_230._M_string_length = puVar11[1];
      *puVar11 = psVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      CoreML::Result::Result((Result *)local_1c0,INVALID_MODEL_PARAMETERS,&local_230);
      __return_storage_ptr__->m_type = local_1c0._0_4_;
      __return_storage_ptr__->m_reason = local_1c0._4_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->m_message,(string *)&local_1b8);
      if (local_1b8._M_p != local_1b0 + 8) {
        operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (local_f8 != local_e8) {
        operator_delete(local_f8,local_e8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00537200;
    }
    else {
      if (bVar12 == 2) {
        local_58 = (layer->name_).ptr_;
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"weight","");
        CoreML::validateGeneralWeightParams
                  ((Result *)local_1c0,weights,local_1c8 * local_210,local_210,&local_198,local_58,
                   &local_230);
        __return_storage_ptr__->m_type = local_1c0._0_4_;
        __return_storage_ptr__->m_reason = local_1c0._4_4_;
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->m_message,(string *)&local_1b8);
        if (local_1b8._M_p != local_1b0 + 8) {
          operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        bVar8 = CoreML::Result::good(__return_storage_ptr__);
        bVar21 = bVar8 & bVar21;
      }
LAB_005370bb:
      if (bVar21 == 0) goto LAB_00537200;
      if (1 < bVar16) {
        if (bVar16 == 2) {
          layerName = (layer->name_).ptr_;
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"bias","");
          CoreML::validateGeneralWeightParams
                    ((Result *)local_1c0,bias,local_210,1,&local_198,layerName,&local_230);
          __return_storage_ptr__->m_type = local_1c0._0_4_;
          __return_storage_ptr__->m_reason = local_1c0._4_4_;
          std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->m_message,(string *)&local_1b8);
          if (local_1b8._M_p != local_1b0 + 8) {
            operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          CoreML::Result::good(__return_storage_ptr__);
        }
        goto LAB_00537200;
      }
      if (bVar16 == 0) {
        uVar20 = (unsigned_long)(bias->floatvalue_).current_size_;
      }
      else {
        uVar20 = ((bias->float16value_).ptr_)->_M_string_length >> 1;
      }
      if (uVar20 == local_210) goto LAB_00537200;
      std::operator+(&local_138,"Layer \'",(layer->name_).ptr_);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
      psVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_178.field_2._M_allocated_capacity = *psVar13;
        local_178.field_2._8_8_ = puVar11[3];
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      }
      else {
        local_178.field_2._M_allocated_capacity = *psVar13;
        local_178._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_178._M_string_length = puVar11[1];
      *puVar11 = psVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      std::__cxx11::to_string(&local_118,uVar20);
      std::operator+(&local_208,&local_178,&local_118);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
      psVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_1e8.field_2._M_allocated_capacity = *psVar13;
        local_1e8.field_2._8_8_ = puVar11[3];
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar13;
        local_1e8._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_1e8._M_string_length = puVar11[1];
      *puVar11 = psVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      std::__cxx11::to_string(&local_158,local_210);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                     &local_1e8,&local_158);
      puVar11 = (undefined8 *)std::__cxx11::string::append(local_1c0);
      psVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_230.field_2._M_allocated_capacity = *psVar13;
        local_230.field_2._8_8_ = puVar11[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar13;
        local_230._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_230._M_string_length = puVar11[1];
      *puVar11 = psVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      if (local_1c0 != (undefined1  [8])local_1b0) {
        operator_delete((void *)local_1c0,local_1b0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      CoreML::Result::Result((Result *)local_1c0,INVALID_MODEL_PARAMETERS,&local_230);
      __return_storage_ptr__->m_type = local_1c0._0_4_;
      __return_storage_ptr__->m_reason = local_1c0._4_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->m_message,(string *)&local_1b8);
      if (local_1b8._M_p != local_1b0 + 8) {
        operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
      }
      local_50.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_230._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p == &local_230.field_2) goto LAB_00537200;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_00537200:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,
                    CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                             local_198.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Result validateInnerProductWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {

    Result r;

    bool has_bias;
    uint64_t num_inputs;
    uint64_t num_outputs;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kInnerProduct: {
            const auto& params = layer.innerproduct();
            num_inputs = params.inputchannels();
            num_outputs = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Inner product";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kBatchedMatmul: {
            const auto& params = layer.batchedmatmul();
            num_inputs = params.weightmatrixfirstdimension();
            num_outputs = params.weightmatrixseconddimension();
            has_bias = params.hasbias();
            layer_type = "BatchedMatMul";
            break;
        }
        default:
            return r;
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Check for weight and bias value type
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() + "' has invalid weights/bias fields.");
        return r;
    }
    // Check that weight and bias should both be FP16/32, or quantized
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    // Check weights
    uint64_t weight_size = 0;
    if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16){
        if (weightsValueType == FLOAT32) {
            weight_size = static_cast<uint64_t>(weights.floatvalue().size());
        } else {
            weight_size = static_cast<uint64_t>(weights.float16value().size() / 2);
        }
        if (num_inputs * num_outputs != weight_size) {
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layer.name() +
                       " has incorrect weight matrix size " + std::to_string(weight_size) +
                       " to encode a " + std::to_string(num_inputs) + " × " +
                       std::to_string(num_outputs) + " " + layer_type + ".");
            return r;
        }
    } else if (weightsValueType == QUINT){
        r = validateGeneralWeightParams(weights, num_inputs * num_outputs, num_outputs,
                                        layer_type, layer.name(), "weight");
        if (!r.good()) return r;
    }

    // Check the bias
    uint64_t bias_size = 0;
    if (has_bias){
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = static_cast<uint64_t>(bias.floatvalue().size());
            } else {
                bias_size = static_cast<uint64_t>(bias.float16value().size() / 2);
            }
            if (bias_size != num_outputs) {
                std::string err = "Layer '" + layer.name() + "' has incorrect bias vector size " +
                std::to_string(bias_size) + " (expected " + std::to_string(num_outputs) + ").";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            r = validateGeneralWeightParams(bias, num_outputs, 1, layer_type,
                                            layer.name(), "bias");
            if (!r.good()) return r;
        }
    } else if (!has_bias && bias_size > 0) {
        std::string err = "Bias vector being ignored since \"hasBias\" flag not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}